

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usda-reader.cc
# Opt level: O0

bool __thiscall tinyusdz::usda::USDAReader::Impl::ReconstructStage(Impl *this)

{
  bool bVar1;
  vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *pvVar2;
  void *local_3a8;
  Value local_3a0;
  undefined1 local_388 [8];
  Prim prim;
  unsigned_long *idx;
  iterator __end2;
  iterator __begin2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2;
  Impl *this_local;
  
  pvVar2 = Stage::root_prims(&this->_stage);
  ::std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::clear(pvVar2);
  __end2._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&this->_toplevel_prims);
  idx = (unsigned_long *)
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&this->_toplevel_prims);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                     *)&idx), bVar1) {
    prim._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)__gnu_cxx::
                 __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator*(&__end2);
    local_3a8 = (void *)0x0;
    tinyusdz::value::Value::Value<decltype(nullptr)>(&local_3a0,&local_3a8);
    Prim::Prim((Prim *)local_388,&local_3a0);
    tinyusdz::value::Value::~Value(&local_3a0);
    bVar1 = anon_unknown_1::ConstructPrimTreeRec
                      (*(size_t *)prim._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count
                       ,&this->_prim_nodes,(Prim *)local_388,&this->_err);
    if (bVar1) {
      pvVar2 = Stage::root_prims(&this->_stage);
      ::std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::emplace_back<tinyusdz::Prim>
                (pvVar2,(Prim *)local_388);
    }
    else {
      this_local._7_1_ = 0;
    }
    Prim::~Prim((Prim *)local_388);
    if (!bVar1) goto LAB_00165f55;
    __gnu_cxx::
    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&__end2);
  }
  Stage::compute_absolute_prim_path_and_assign_prim_id(&this->_stage,true);
  this_local._7_1_ = 1;
LAB_00165f55:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool USDAReader::Impl::ReconstructStage() {
  _stage.root_prims().clear();

  for (const auto &idx : _toplevel_prims) {
    DCOUT("Toplevel prim idx: " << std::to_string(idx));

    Prim prim(value::Value(nullptr)); // init with dummy Prim
    if (!ConstructPrimTreeRec(idx, _prim_nodes, &prim, &_err)) {
      return false;
    }

    _stage.root_prims().emplace_back(std::move(prim));

    DCOUT("num_children = " << _stage.root_prims()[size_t(_stage.root_prims().size() - 1)].children().size());
  }

  // Compute Abs Path from built Prim tree and Assign prim id.
  _stage.compute_absolute_prim_path_and_assign_prim_id();

  return true;
}